

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

Value * __thiscall Kvm::readPair(Kvm *this,istream *in)

{
  Kgc *this_00;
  pointer *ppppVVar1;
  uint uVar2;
  int iVar3;
  Value *pVVar4;
  Value *pVVar5;
  runtime_error *prVar6;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  byte bVar7;
  Value *pVVar8;
  char c;
  Value *cdr_obj;
  Value *car_obj;
  byte local_61;
  Value *local_60;
  Value *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  anon_unknown.dwarf_ec09::eatWhitespace(in);
  std::operator>>(in,(char *)&local_61);
  if (local_61 == 0x29) {
    return this->NIL;
  }
  std::istream::putback((char)in);
  local_58 = (Value *)0x0;
  local_60 = (Value *)0x0;
  this_00 = &this->gc_;
  Kgc::pushLocalStackRoot(this_00,&local_58);
  Kgc::pushLocalStackRoot(this_00,&local_60);
  local_58 = (Value *)read(this,(int)in,__buf,in_RCX);
  if (local_58 == (Value *)0x0) {
LAB_0010c490:
    pVVar4 = (Value *)0x0;
  }
  else {
    anon_unknown.dwarf_ec09::eatWhitespace(in);
    std::operator>>(in,(char *)&local_61);
    if (local_61 == 0x2e) {
      uVar2 = std::istream::peek();
      bVar7 = (byte)uVar2;
      local_61 = bVar7;
      iVar3 = isspace((int)(char)bVar7);
      if ((iVar3 == 0) &&
         ((0x3b < bVar7 ||
          (in_RCX = 0x800030400000000,
          (0x800030400000000U >> ((ulong)(uVar2 & 0xff) & 0x3f) & 1) == 0)))) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"dot not followed by delimiter","");
        std::runtime_error::runtime_error(prVar6,(string *)local_50);
        *(undefined ***)prVar6 = &PTR__runtime_error_00113b48;
        __cxa_throw(prVar6,&(anonymous_namespace)::KatException::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      local_60 = (Value *)read(this,(int)in,__buf_00,in_RCX);
      if (local_60 == (Value *)0x0) goto LAB_0010c490;
      anon_unknown.dwarf_ec09::eatWhitespace(in);
      std::operator>>(in,(char *)&local_61);
      pVVar8 = local_58;
      pVVar5 = local_60;
      if (local_61 != 0x29) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"where was the trailing paren?","");
        std::runtime_error::runtime_error(prVar6,(string *)local_50);
        *(undefined ***)prVar6 = &PTR__runtime_error_00113b48;
        __cxa_throw(prVar6,&(anonymous_namespace)::KatException::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      pVVar4 = Kgc::allocValue(this_00,CELL);
    }
    else {
      std::istream::putback((char)in);
      pVVar5 = readPair(this,in);
      pVVar8 = local_58;
      local_60 = pVVar5;
      pVVar4 = Kgc::allocValue(this_00,CELL);
    }
    pVVar4[1]._vptr_Value = (_func_int **)pVVar8;
    *(Value **)&pVVar4[1].type_ = pVVar5;
  }
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -2;
  return pVVar4;
}

Assistant:

const Value* Kvm::readPair(std::istream &in)
{
    eatWhitespace(in);

    char c;
    in >> c;
    if (c == ')') return NIL;
    in.putback(c);

    const Value *car_obj = nullptr;
    const Value *cdr_obj = nullptr;
    GcGuard readGuard{gc_};
    readGuard.pushLocalStackRoot(&car_obj);
    readGuard.pushLocalStackRoot(&cdr_obj);

    car_obj = read(in);
    if (!car_obj) return nullptr;
    eatWhitespace(in);
    in >> c;
    if (c == '.')  /* improper list */
    {
        c = in.peek(); // FIXME: peek returns int
        if (!isDelimiter(c))
        {
            throw KatException("dot not followed by delimiter");
        }
        cdr_obj = read(in);
        if (!cdr_obj) return nullptr;
        eatWhitespace(in);
        in >> c;
        if (c != ')')
        {
            throw KatException("where was the trailing paren?");
        }
        auto result = makeCell(car_obj, cdr_obj);
        return result;
    } else /* read list */
    {
        in.putback(c);
        cdr_obj = readPair(in);
        auto result = makeCell(car_obj, cdr_obj);
        return result;
    }
}